

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_set_alpha_mode_fixed(png_structrp png_ptr,int mode,png_fixed_point output_gamma)

{
  bool bVar1;
  int iVar2;
  png_fixed_point pVar3;
  png_fixed_point file_gamma;
  int compose;
  png_fixed_point output_gamma_local;
  int mode_local;
  png_structrp png_ptr_local;
  
  bVar1 = false;
  iVar2 = png_rtran_ok(png_ptr,0);
  if (iVar2 != 0) {
    file_gamma = translate_gamma_flags(png_ptr,output_gamma,1);
    if ((file_gamma < 1000) || (10000000 < file_gamma)) {
      png_error(png_ptr,"output gamma out of expected range");
    }
    pVar3 = png_reciprocal(file_gamma);
    switch(mode) {
    case 0:
      png_ptr->transformations = png_ptr->transformations & 0xff7fffff;
      png_ptr->flags = png_ptr->flags & 0xffffdfff;
      break;
    case 1:
      bVar1 = true;
      png_ptr->transformations = png_ptr->transformations & 0xff7fffff;
      png_ptr->flags = png_ptr->flags & 0xffffdfff;
      file_gamma = 100000;
      break;
    case 2:
      bVar1 = true;
      png_ptr->transformations = png_ptr->transformations & 0xff7fffff;
      png_ptr->flags = png_ptr->flags | 0x2000;
      break;
    case 3:
      bVar1 = true;
      png_ptr->transformations = png_ptr->transformations | 0x800000;
      png_ptr->flags = png_ptr->flags & 0xffffdfff;
      break;
    default:
      png_error(png_ptr,"invalid alpha mode");
    }
    if ((png_ptr->colorspace).gamma == 0) {
      (png_ptr->colorspace).gamma = pVar3;
      (png_ptr->colorspace).flags = (png_ptr->colorspace).flags | 1;
    }
    png_ptr->screen_gamma = file_gamma;
    if (bVar1) {
      memset(&png_ptr->background,0,10);
      png_ptr->background_gamma = (png_ptr->colorspace).gamma;
      png_ptr->background_gamma_type = '\x02';
      png_ptr->transformations = png_ptr->transformations & 0xfffffeff;
      if ((png_ptr->transformations & 0x80) != 0) {
        png_error(png_ptr,"conflicting calls to set alpha mode and background");
      }
      png_ptr->transformations = png_ptr->transformations | 0x80;
    }
  }
  return;
}

Assistant:

void PNGFAPI
png_set_alpha_mode_fixed(png_structrp png_ptr, int mode,
    png_fixed_point output_gamma)
{
   int compose = 0;
   png_fixed_point file_gamma;

   png_debug(1, "in png_set_alpha_mode");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   output_gamma = translate_gamma_flags(png_ptr, output_gamma, 1/*screen*/);

   /* Validate the value to ensure it is in a reasonable range. The value
    * is expected to be 1 or greater, but this range test allows for some
    * viewing correction values.  The intent is to weed out users of this API
    * who use the inverse of the gamma value accidentally!  Since some of these
    * values are reasonable this may have to be changed:
    *
    * 1.6.x: changed from 0.07..3 to 0.01..100 (to accomodate the optimal 16-bit
    * gamma of 36, and its reciprocal.)
    */
   if (output_gamma < 1000 || output_gamma > 10000000)
      png_error(png_ptr, "output gamma out of expected range");

   /* The default file gamma is the inverse of the output gamma; the output
    * gamma may be changed below so get the file value first:
    */
   file_gamma = png_reciprocal(output_gamma);

   /* There are really 8 possibilities here, composed of any combination
    * of:
    *
    *    premultiply the color channels
    *    do not encode non-opaque pixels
    *    encode the alpha as well as the color channels
    *
    * The differences disappear if the input/output ('screen') gamma is 1.0,
    * because then the encoding is a no-op and there is only the choice of
    * premultiplying the color channels or not.
    *
    * png_set_alpha_mode and png_set_background interact because both use
    * png_compose to do the work.  Calling both is only useful when
    * png_set_alpha_mode is used to set the default mode - PNG_ALPHA_PNG - along
    * with a default gamma value.  Otherwise PNG_COMPOSE must not be set.
    */
   switch (mode)
   {
      case PNG_ALPHA_PNG:        /* default: png standard */
         /* No compose, but it may be set by png_set_background! */
         png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
         png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
         break;

      case PNG_ALPHA_ASSOCIATED: /* color channels premultiplied */
         compose = 1;
         png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
         png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
         /* The output is linear: */
         output_gamma = PNG_FP_1;
         break;

      case PNG_ALPHA_OPTIMIZED:  /* associated, non-opaque pixels linear */
         compose = 1;
         png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
         png_ptr->flags |= PNG_FLAG_OPTIMIZE_ALPHA;
         /* output_gamma records the encoding of opaque pixels! */
         break;

      case PNG_ALPHA_BROKEN:     /* associated, non-linear, alpha encoded */
         compose = 1;
         png_ptr->transformations |= PNG_ENCODE_ALPHA;
         png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
         break;

      default:
         png_error(png_ptr, "invalid alpha mode");
   }

   /* Only set the default gamma if the file gamma has not been set (this has
    * the side effect that the gamma in a second call to png_set_alpha_mode will
    * be ignored.)
    */
   if (png_ptr->colorspace.gamma == 0)
   {
      png_ptr->colorspace.gamma = file_gamma;
      png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;
   }

   /* But always set the output gamma: */
   png_ptr->screen_gamma = output_gamma;

   /* Finally, if pre-multiplying, set the background fields to achieve the
    * desired result.
    */
   if (compose != 0)
   {
      /* And obtain alpha pre-multiplication by composing on black: */
      memset(&png_ptr->background, 0, (sizeof png_ptr->background));
      png_ptr->background_gamma = png_ptr->colorspace.gamma; /* just in case */
      png_ptr->background_gamma_type = PNG_BACKGROUND_GAMMA_FILE;
      png_ptr->transformations &= ~PNG_BACKGROUND_EXPAND;

      if ((png_ptr->transformations & PNG_COMPOSE) != 0)
         png_error(png_ptr,
             "conflicting calls to set alpha mode and background");

      png_ptr->transformations |= PNG_COMPOSE;
   }
}